

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

EnumValueDescriptor * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetEnum
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  int default_value;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  EnumValueDescriptor *this_01;
  int *piVar5;
  EnumDescriptor *pEVar6;
  LogMessage *pLVar7;
  string *psVar8;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  EnumValueDescriptor *local_30;
  EnumValueDescriptor *result;
  FieldDescriptor *pFStack_20;
  int value;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pFStack_20 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,pFStack_20,"GetEnum","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(pFStack_20);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,pFStack_20,"GetEnum",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(pFStack_20);
  if (CVar3 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,pFStack_20,"GetEnum",CPPTYPE_ENUM);
  }
  bVar1 = FieldDescriptor::is_extension(pFStack_20);
  if (bVar1) {
    this_00 = GetExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number(pFStack_20);
    this_01 = FieldDescriptor::default_value_enum(pFStack_20);
    default_value = EnumValueDescriptor::number(this_01);
    result._4_4_ = ExtensionSet::GetEnum(this_00,number,default_value);
  }
  else {
    piVar5 = GetField<int>(this,(Message *)field_local,pFStack_20);
    result._4_4_ = *piVar5;
  }
  pEVar6 = FieldDescriptor::enum_type(pFStack_20);
  local_30 = EnumDescriptor::FindValueByNumber(pEVar6,result._4_4_);
  local_69 = 0;
  if (local_30 == (EnumValueDescriptor *)0x0) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
               ,0x38d);
    local_69 = 1;
    pLVar7 = LogMessage::operator<<(&local_68,"CHECK failed: result != NULL: ");
    pLVar7 = LogMessage::operator<<(pLVar7,"Value ");
    pLVar7 = LogMessage::operator<<(pLVar7,result._4_4_);
    pLVar7 = LogMessage::operator<<(pLVar7," is not valid for field ");
    psVar8 = FieldDescriptor::full_name_abi_cxx11_(pFStack_20);
    pLVar7 = LogMessage::operator<<(pLVar7,psVar8);
    pLVar7 = LogMessage::operator<<(pLVar7," of type ");
    pEVar6 = FieldDescriptor::enum_type(pFStack_20);
    psVar8 = EnumDescriptor::full_name_abi_cxx11_(pEVar6);
    pLVar7 = LogMessage::operator<<(pLVar7,psVar8);
    pLVar7 = LogMessage::operator<<(pLVar7,".");
    LogFinisher::operator=(local_7d,pLVar7);
  }
  if ((local_69 & 1) != 0) {
    LogMessage::~LogMessage(&local_68);
  }
  return local_30;
}

Assistant:

const EnumValueDescriptor* GeneratedMessageReflection::GetEnum(
    const Message& message, const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetEnum, SINGULAR, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetEnum(
      field->number(), field->default_value_enum()->number());
  } else {
    value = GetField<int>(message, field);
  }
  const EnumValueDescriptor* result =
    field->enum_type()->FindValueByNumber(value);
  GOOGLE_CHECK(result != NULL) << "Value " << value << " is not valid for field "
                        << field->full_name() << " of type "
                        << field->enum_type()->full_name() << ".";
  return result;
}